

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void mi_free_generic_local(mi_page_t *page,mi_segment_t *segment,void *p)

{
  uint16_t *puVar1;
  long lVar2;
  uintptr_t uVar3;
  mi_heap_t *heap;
  ulong uVar4;
  mi_page_queue_t *pmVar5;
  mi_page_t *in_RCX;
  byte bVar6;
  
  if (((page->flags).full_aligned & 2) != 0) {
    uVar4 = (long)segment - (long)page->page_start;
    in_RCX = (mi_page_t *)(ulong)page->block_size_shift;
    if (in_RCX == (mi_page_t *)0x0) {
      uVar4 = uVar4 % page->block_size;
    }
    else {
      uVar4 = uVar4 & ~(-1L << (page->block_size_shift & 0x3f));
    }
    segment = (mi_segment_t *)((long)segment - uVar4);
  }
  (segment->memid).mem.os.base = page->local_free;
  page->local_free = (mi_block_t *)segment;
  puVar1 = &page->used;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    bVar6 = (page->flags).full_aligned & 0xfd;
    (page->flags).full_aligned = bVar6;
    pmVar5 = mi_heap_page_queue_of((mi_heap_t *)page->xheap,page);
    if (((pmVar5->block_size < 0x10001) && (pmVar5->last == page)) && (pmVar5->first == page)) {
      bVar6 = 8;
      if (page->block_size < 0x2001) {
        bVar6 = 0x20;
      }
      page->field_0xf = page->field_0xf & 1 | bVar6;
      uVar3 = page->xheap;
      uVar4 = (long)((long)pmVar5 + (-0x500 - uVar3)) / 0x18;
      if (uVar4 < *(ulong *)(uVar3 + 200)) {
        *(ulong *)(uVar3 + 200) = uVar4;
      }
      if (*(ulong *)(uVar3 + 0xd0) < uVar4) {
        *(ulong *)(uVar3 + 0xd0) = uVar4;
      }
      return;
    }
    (page->flags).full_aligned = bVar6;
    lVar2 = *(long *)page->xheap;
    mi_page_queue_remove(pmVar5,page);
    page->xheap = 0;
    _mi_segment_page_free(page,false,(mi_segments_tld_t *)(lVar2 + 0x20));
    return;
  }
  if (((page->flags).full_aligned & 1) == 0) {
    return;
  }
  bVar6 = (page->flags).full_aligned;
  if ((bVar6 & 1) == 0) {
    return;
  }
  heap = (mi_heap_t *)page->xheap;
  (page->flags).full_aligned = bVar6 & 0xfe;
  pmVar5 = mi_heap_page_queue_of(heap,page);
  (page->flags).full_aligned = bVar6;
  mi_page_queue_enqueue_from_ex(pmVar5,heap->pages + 0x4a,SUB81(page,0),in_RCX);
  return;
}

Assistant:

static inline bool mi_page_has_aligned(const mi_page_t* page) {
  return page->flags.x.has_aligned;
}